

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O1

string * __thiscall
iDynTree::Traversal::toString_abi_cxx11_
          (string *__return_storage_ptr__,Traversal *this,Model *model)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  LinkIndex LVar4;
  undefined4 extraout_var;
  ulong uVar5;
  stringstream ss;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Traversal: ",0xb);
  cVar1 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if ((int)((ulong)((long)(this->links).
                          super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->links).
                         super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) != 0) {
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]\tLink: ",8);
      LVar4 = Link::getIndex((this->links).
                             super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar5]);
      Model::getLinkName_abi_cxx11_(&local_1e0,model,LVar4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[",1);
      Link::getIndex((this->links).
                     super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar5]);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if (uVar5 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"\tJoint to parent : ",0x13);
        iVar2 = (*(this->toParentJoints).
                  super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar5]->_vptr_IJoint[0x14])();
        Model::getJointName_abi_cxx11_(&local_1e0,model,CONCAT44(extraout_var,iVar2));
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,
                            local_1e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[",1);
        (*(this->toParentJoints).
          super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar5]->_vptr_IJoint[0x14])();
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"\tParent link     : ",0x13);
        LVar4 = Link::getIndex((this->parents).
                               super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar5]);
        Model::getLinkName_abi_cxx11_(&local_1e0,model,LVar4);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,
                            local_1e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[",1);
        Link::getIndex((this->parents).
                       super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar5]);
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < ((ulong)((long)(this->links).
                                    super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->links).
                                   super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_1c0;
}

Assistant:

std::string Traversal::toString(const Model & model) const
{
    std::stringstream ss;

    ss << "Traversal: " << std::endl;
    for(size_t i=0; i < this->getNrOfVisitedLinks(); i++ )
    {
        ss << "[" << i << "]\tLink: " << model.getLinkName(this->getLink(i)->getIndex()) << "[" << this->getLink(i)->getIndex() << "]" << std::endl;
        if( i > 0 )
        {
           ss << "\tJoint to parent : " << model.getJointName(this->getParentJoint(i)->getIndex()) << "[" << this->getParentJoint(i)->getIndex() << "]" << std::endl;
           ss << "\tParent link     : " << model.getLinkName(this->getParentLink(i)->getIndex()) << "[" << this->getParentLink(i)->getIndex() << "]" << std::endl;
        }
    }

    return ss.str();
}